

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O3

void __thiscall csguide_webserver::ThreadPool::Shutdown(ThreadPool *this,bool graceful)

{
  int iVar1;
  MutexLockGuard guard;
  long lVar2;
  
  pthread_mutex_lock((pthread_mutex_t *)this);
  if (this->shutdown_ != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"has shutdown",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
  }
  this->shutdown_ = graceful + 1;
  pthread_cond_broadcast((pthread_cond_t *)&(this->condition_).cond_);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  if (0 < this->thread_size_) {
    lVar2 = 0;
    do {
      iVar1 = pthread_join((this->threads_).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[lVar2],(void **)0x0);
      if (iVar1 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"pthread_join error",0x12);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
        std::ostream::put(-0x48);
        std::ostream::flush();
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < this->thread_size_);
  }
  return;
}

Assistant:

void ThreadPool::Shutdown(bool graceful) {
  {
    MutexLockGuard guard(this->mutex_);
    if (shutdown_) {
      std::cout << "has shutdown" << std::endl;
    }
    shutdown_ = graceful ? graceful_mode : immediate_mode;
      condition_.NotifyAll();
  }
  for (int i = 0; i < thread_size_; i++) {
    if (pthread_join(threads_[i], NULL) != 0) {
      std::cout << "pthread_join error" << std::endl;
    }
  }
}